

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall
cppcms::widgets::select_multiple::render_input(select_multiple *this,form_context *context)

{
  widget_part_type wVar1;
  html_type hVar2;
  escape *peVar3;
  ostream *poVar4;
  ulong uVar5;
  size_type sVar6;
  streamable *this_00;
  base_widget *in_RSI;
  long *in_RDI;
  element *el;
  uint i;
  ostream *out;
  escape *in_stack_fffffffffffffee8;
  escape *in_stack_fffffffffffffef0;
  escape *this_01;
  streamable *in_stack_fffffffffffffef8;
  string *s;
  form_context *in_stack_ffffffffffffff30;
  streamable local_c0;
  undefined1 local_a0 [88];
  string local_48;
  undefined8 local_28;
  uint local_20;
  uint local_1c;
  form_context *in_stack_ffffffffffffffe8;
  
  base_widget::auto_generate(in_RSI,in_stack_ffffffffffffffe8);
  peVar3 = (escape *)form_context::out(in_stack_ffffffffffffff30);
  wVar1 = form_context::widget_part((form_context *)in_RSI);
  if (wVar1 == first_part) {
    hVar2 = form_context::html((form_context *)in_RSI);
    if (hVar2 == as_xhtml) {
      std::operator<<((ostream *)peVar3,"<select multiple=\"multiple\" ");
    }
    else {
      std::operator<<((ostream *)peVar3,"<select multiple ");
    }
    if ((int)in_RDI[0x45] != 0) {
      std::operator<<((ostream *)peVar3," size=\"");
      local_1c = (uint)impl::cint<unsigned_int>(0x3fb412);
      poVar4 = impl::details::operator<<
                         ((ostream *)in_stack_fffffffffffffef0,
                          (write_int_to_stream<unsigned_int> *)in_stack_fffffffffffffee8);
      std::operator<<(poVar4,"\" ");
    }
    (**(code **)(*in_RDI + 0x48))(in_RDI,in_RSI);
  }
  else {
    std::operator<<((ostream *)peVar3," >\n");
    for (local_20 = 0; uVar5 = (ulong)local_20,
        sVar6 = std::
                vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                ::size((vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                        *)(in_RDI + 0x41)), uVar5 < sVar6; local_20 = local_20 + 1) {
      local_28 = std::
                 vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                 ::operator[]((vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                               *)(in_RDI + 0x41),(ulong)local_20);
      this_00 = (streamable *)std::operator<<((ostream *)peVar3,"<option value=\"");
      s = (string *)(local_a0 + 0x58);
      util::escape(s);
      poVar4 = std::operator<<((ostream *)this_00,(string *)s);
      std::operator<<(poVar4,"\" ");
      std::__cxx11::string::~string((string *)(local_a0 + 0x58));
      this_01 = in_stack_fffffffffffffef0;
      if ((*(uint *)local_28 & 1) != 0) {
        hVar2 = form_context::html((form_context *)in_RSI);
        if (hVar2 == as_xhtml) {
          std::operator<<((ostream *)peVar3,"selected=\"selected\" ");
          this_01 = in_stack_fffffffffffffef0;
        }
        else {
          std::operator<<((ostream *)peVar3,"selected ");
          this_01 = in_stack_fffffffffffffef0;
        }
      }
      in_stack_fffffffffffffef0 = peVar3;
      std::operator<<((ostream *)in_stack_fffffffffffffef0,">");
      peVar3 = in_stack_fffffffffffffef0;
      if ((*(uint *)local_28 >> 1 & 1) == 0) {
        in_stack_fffffffffffffef8 = &local_c0;
        util::escape(s);
        std::operator<<((ostream *)in_stack_fffffffffffffef0,(string *)in_stack_fffffffffffffef8);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      else {
        filters::streamable::streamable<booster::locale::basic_message<char>>
                  (this_00,(basic_message<char> *)local_a0);
        filters::escape::escape(in_stack_fffffffffffffef0,in_stack_fffffffffffffef8);
        filters::operator<<((ostream *)this_01,in_stack_fffffffffffffee8);
        filters::escape::~escape(this_01);
        filters::streamable::~streamable((streamable *)local_a0);
        in_stack_fffffffffffffef0 = this_01;
      }
      std::operator<<((ostream *)peVar3,"</option>\n");
    }
    std::operator<<((ostream *)peVar3,"</select>");
  }
  return;
}

Assistant:

void select_multiple::render_input(form_context &context)
{
	auto_generate(&context);
	std::ostream &out=context.out();
	if(context.widget_part() == first_part) {
		if(context.html() == as_xhtml)
			out<<"<select multiple=\"multiple\" ";
		else
			out<<"<select multiple ";
		if(rows_ > 0)
			out << " size=\"" << cint(rows_) << "\" ";
		render_attributes(context);
	}
	else {
		out<<" >\n";
		for(unsigned i=0;i<elements_.size();i++) {
			element &el=elements_[i];
			out << "<option value=\"" << util::escape(el.id) <<"\" ";
			if(el.selected) {
				if(context.html() == as_xhtml)
					out << "selected=\"selected\" ";
				else
					out << "selected ";
			}
			out << ">";
			if(el.need_translation)
				out << filters::escape(el.tr_option);
			else
				out << util::escape(el.str_option);
			out << "</option>\n";
		}
		out << "</select>";
	}
}